

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ModbusSimulationDataGenerator.cpp
# Opt level: O2

void __thiscall
ModbusSimulationDataGenerator::SendWriteMultipleCoilsRequest
          (ModbusSimulationDataGenerator *this,U8 DeviceID,U16 StartingAddress,U16 Quantity,
          U8 ByteCount,U8 *Values)

{
  byte bVar1;
  ushort uVar2;
  int i;
  ulong uVar3;
  int iVar4;
  U64 value;
  uint uVar5;
  uint uVar6;
  ModbusSimulationDataGenerator *this_00;
  int i_1;
  ulong uVar8;
  ModbusSimulationDataGenerator *pMVar7;
  
  if (this->mSettings->mModbusMode == ModbusRTUClient) {
    CreateModbusByte(this,(ulong)DeviceID);
    uVar6 = (int)this + 0x30;
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar6);
    CreateModbusByte(this,0xf);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar6);
    CreateModbusByte(this,(ulong)(StartingAddress & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar6);
    CreateModbusByte(this,(ulong)(StartingAddress >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar6);
    CreateModbusByte(this,(ulong)(Quantity & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar6);
    CreateModbusByte(this,(ulong)(Quantity >> 8));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar6);
    uVar3 = (ulong)ByteCount;
    CreateModbusByte(this,uVar3);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar6);
    for (uVar8 = 0; uVar3 != uVar8; uVar8 = uVar8 + 1) {
      CreateModbusByte(this,(ulong)Values[uVar8]);
      ClockGenerator::AdvanceByHalfPeriod(10.0);
      SimulationChannelDescriptor::Advance(uVar6);
    }
    uVar2 = this->crc_tab16
            [(uint)(Quantity >> 8) ^
             (ushort)(this->crc_tab16
                      [(uint)(StartingAddress >> 8) ^
                       (ushort)(this->crc_tab16[this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xf0] >> 8
                               ^ this->crc_tab16
                                 [(ushort)(StartingAddress ^ this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                          this->crc_tab16
                                          [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xf0]) & 0xff])
                       & 0xff] >> 8 ^
                     this->crc_tab16
                     [(ushort)(Quantity ^
                               this->crc_tab16
                               [(ushort)(StartingAddress ^ this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                        this->crc_tab16
                                        [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xf0]) & 0xff] >>
                               8 ^ this->crc_tab16
                                   [(uint)(StartingAddress >> 8) ^
                                    (ushort)(this->crc_tab16
                                             [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xf0] >> 8 ^
                                            this->crc_tab16
                                            [(ushort)(StartingAddress ^
                                                      this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                     this->crc_tab16
                                                     [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xf0
                                                     ]) & 0xff]) & 0xff]) & 0xff]) & 0xff] >> 8 ^
            this->crc_tab16
            [(byte)((byte)(this->crc_tab16
                           [(ushort)(Quantity ^
                                     this->crc_tab16
                                     [(ushort)(StartingAddress ^
                                               this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                              this->crc_tab16
                                              [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xf0]) &
                                      0xff] >> 8 ^
                                    this->crc_tab16
                                    [(uint)(StartingAddress >> 8) ^
                                     (ushort)(this->crc_tab16
                                              [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xf0] >> 8
                                             ^ this->crc_tab16
                                               [(ushort)(StartingAddress ^
                                                         this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                        this->crc_tab16
                                                        [this->crc_tab16[(byte)~DeviceID] & 0xff ^
                                                         0xf0]) & 0xff]) & 0xff]) & 0xff] >> 8) ^
                    (byte)this->crc_tab16
                          [(uint)(Quantity >> 8) ^
                           (ushort)(this->crc_tab16
                                    [(uint)(StartingAddress >> 8) ^
                                     (ushort)(this->crc_tab16
                                              [this->crc_tab16[(byte)~DeviceID] & 0xff ^ 0xf0] >> 8
                                             ^ this->crc_tab16
                                               [(ushort)(StartingAddress ^
                                                         this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                        this->crc_tab16
                                                        [this->crc_tab16[(byte)~DeviceID] & 0xff ^
                                                         0xf0]) & 0xff]) & 0xff] >> 8 ^
                                   this->crc_tab16
                                   [(ushort)(Quantity ^
                                             this->crc_tab16
                                             [(ushort)(StartingAddress ^
                                                       this->crc_tab16[(byte)~DeviceID] >> 8 ^
                                                      this->crc_tab16
                                                      [this->crc_tab16[(byte)~DeviceID] & 0xff ^
                                                       0xf0]) & 0xff] >> 8 ^
                                            this->crc_tab16
                                            [(uint)(StartingAddress >> 8) ^
                                             (ushort)(this->crc_tab16
                                                      [this->crc_tab16[(byte)~DeviceID] & 0xff ^
                                                       0xf0] >> 8 ^
                                                     this->crc_tab16
                                                     [(ushort)(StartingAddress ^
                                                               this->crc_tab16[(byte)~DeviceID] >> 8
                                                              ^ this->crc_tab16
                                                                [this->crc_tab16[(byte)~DeviceID] &
                                                                 0xff ^ 0xf0]) & 0xff]) & 0xff]) &
                                    0xff]) & 0xff] ^ ByteCount)];
    uVar8 = 0;
    while( true ) {
      if (uVar3 == uVar8) break;
      uVar2 = uVar2 >> 8 ^ this->crc_tab16[(byte)((byte)uVar2 ^ Values[uVar8])];
      uVar8 = uVar8 + 1;
    }
    CreateModbusByte(this,(ulong)(uVar2 & 0xff));
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar6);
    value = (U64)(uVar2 >> 8);
  }
  else {
    uVar6 = (uint)ByteCount;
    iVar4 = (uint)DeviceID + (uint)StartingAddress + (uint)(StartingAddress >> 8) +
            (uint)Quantity + (uint)(Quantity >> 8) + uVar6 + 0xf;
    for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
      iVar4 = iVar4 + (uint)Values[uVar3];
    }
    CreateModbusByte(this,0x3a);
    this_00 = (ModbusSimulationDataGenerator *)&this->mModbusSimulationData;
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    uVar5 = (uint)this_00;
    pMVar7 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar7,DeviceID >> 4);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar7 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar7,DeviceID & 0xf);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,0x30);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,0x46);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar7 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar7,(byte)(StartingAddress >> 0xc));
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar7 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar7,(U8)((StartingAddress & 0xf0f) >> 8));
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar7 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar7,(byte)StartingAddress >> 4);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar7 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar7,(U8)(StartingAddress & 0xf0f));
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar7 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar7,(byte)(Quantity >> 0xc));
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar7 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar7,(U8)((Quantity & 0xf0f) >> 8));
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar7 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar7,(byte)Quantity >> 4);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar7 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar7,(U8)(Quantity & 0xf0f));
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar7 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar7,ByteCount >> 4);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar7 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(pMVar7,ByteCount & 0xf);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    pMVar7 = this_00;
    SimulationChannelDescriptor::Advance(uVar5);
    for (uVar3 = 0; uVar6 != uVar3; uVar3 = uVar3 + 1) {
      bVar1 = BinToLATIN1(pMVar7,Values[uVar3] >> 4);
      CreateModbusByte(this,(ulong)bVar1);
      ClockGenerator::AdvanceByHalfPeriod(10.0);
      pMVar7 = this_00;
      SimulationChannelDescriptor::Advance(uVar5);
      bVar1 = BinToLATIN1(pMVar7,Values[uVar3] & 0xf);
      CreateModbusByte(this,(ulong)bVar1);
      ClockGenerator::AdvanceByHalfPeriod(10.0);
      pMVar7 = this_00;
      SimulationChannelDescriptor::Advance(uVar5);
    }
    bVar1 = BinToLATIN1(pMVar7,(byte)-(char)iVar4 >> 4);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    bVar1 = BinToLATIN1(this_00,-(char)iVar4 & 0xf);
    CreateModbusByte(this,(ulong)bVar1);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    CreateModbusByte(this,0xd);
    ClockGenerator::AdvanceByHalfPeriod(10.0);
    SimulationChannelDescriptor::Advance(uVar5);
    value = 10;
  }
  CreateModbusByte(this,value);
  ClockGenerator::AdvanceByHalfPeriod(10.0);
  SimulationChannelDescriptor::Advance((int)this + 0x30);
  return;
}

Assistant:

void ModbusSimulationDataGenerator::SendWriteMultipleCoilsRequest( U8 DeviceID, U16 StartingAddress, U16 Quantity, U8 ByteCount,
                                                                   U8 Values[] )
{
    if( mSettings->mModbusMode == ModbusAnalyzerEnums::ModbusRTUClient )
    {
        CreateModbusByte( DeviceID );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( 0x0F );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( StartingAddress & 0x00FF );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( StartingAddress & 0xFF00 ) >> 8 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( Quantity & 0x00FF );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( Quantity & 0xFF00 ) >> 8 );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ByteCount );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        for( int i = 0; i < ByteCount; i++ )
        {
            CreateModbusByte( Values[ i ] );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
        }

        U16 CRCValue = 0xFFFF; // Modbus/RTU uses CRC-16, calls for initialization to 0xFFFF
        CRCValue = update_CRC( CRCValue, DeviceID );
        CRCValue = update_CRC( CRCValue, 0x0F );
        CRCValue = update_CRC( CRCValue, StartingAddress & 0x00FF );
        CRCValue = update_CRC( CRCValue, ( StartingAddress & 0xFF00 ) >> 8 );
        CRCValue = update_CRC( CRCValue, Quantity & 0x00FF );
        CRCValue = update_CRC( CRCValue, ( Quantity & 0xFF00 ) >> 8 );
        CRCValue = update_CRC( CRCValue, ByteCount );

        for( int i = 0; i < ByteCount; i++ )
        {
            CRCValue = update_CRC( CRCValue, Values[ i ] );
        }

        CreateModbusByte( ( CRCValue & 0x00FF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle

        CreateModbusByte( ( ( CRCValue & 0xFF00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) ); // insert 10 bit-periods of idle
    }
    else
    {
        // it's easier to compute the LRC before converting the data from binary to ASCII
        U16 LRCvalue = 0x00; // Modbus/ASCII uses LRC, initialization to 0x00;

        LRCvalue = LRCvalue + DeviceID;
        LRCvalue = LRCvalue + 0x0F;
        LRCvalue = LRCvalue + ( StartingAddress & 0x00FF );
        LRCvalue = LRCvalue + ( ( StartingAddress & 0xFF00 ) >> 8 );
        LRCvalue = LRCvalue + ( Quantity & 0x00FF );
        LRCvalue = LRCvalue + ( ( Quantity & 0xFF00 ) >> 8 );
        LRCvalue = LRCvalue + ByteCount;

        for( int i = 0; i < ByteCount; i++ )
        {
            LRCvalue = LRCvalue + Values[ i ];
        }

        LRCvalue = ~LRCvalue + 1;
        LRCvalue = LRCvalue & 0x00FF;

        CreateModbusByte( ':' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( DeviceID & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '0' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( 'F' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( StartingAddress & 0xF000 ) >> 12 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( StartingAddress & 0x0F00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( StartingAddress & 0x00F0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( StartingAddress & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( Quantity & 0xF000 ) >> 12 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( Quantity & 0x0F00 ) >> 8 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( Quantity & 0x00F0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( Quantity & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( BinToLATIN1( ( ByteCount & 0xF0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ByteCount & 0xF ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        for( int i = 0; i < ByteCount; i++ )
        {
            CreateModbusByte( BinToLATIN1( ( Values[ i ] & 0xF0 ) >> 4 ) );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
            CreateModbusByte( BinToLATIN1( Values[ i ] & 0xF ) );
            mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        }

        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF0 ) >> 4 ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( BinToLATIN1( ( LRCvalue & 0xF ) ) );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );

        CreateModbusByte( '\r' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
        CreateModbusByte( '\n' );
        mModbusSimulationData.Advance( mClockGenerator.AdvanceByHalfPeriod( 10.0 ) );
    }
}